

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O2

EC_T_DWORD
CreateLinkParmsFromCmdLine
          (EC_T_CHAR **ptcWord,EC_T_CHAR **lpCmdLine,EC_T_CHAR *tcStorage,EC_T_BOOL *pbGetNextWord,
          EC_T_LINK_PARMS **ppLinkParms)

{
  EC_T_DWORD in_EAX;
  int iVar1;
  EC_T_BOOL EVar2;
  EC_T_LINK_PARMS *pLinkParms;
  char *pcVar3;
  size_t sVar4;
  EC_T_DWORD dwSize;
  EC_T_CHAR *tcStorage_00;
  EC_T_CHAR *tcStorage_01;
  EC_T_CHAR *tcStorage_02;
  EC_T_CHAR *tcStorage_03;
  EC_T_DWORD dwSignature;
  EC_T_DWORD *pEVar5;
  EC_T_DWORD dwInstance;
  EC_T_LINKMODE in_R9D;
  
  dwInstance = (EC_T_DWORD)ppLinkParms;
  pcVar3 = *ptcWord;
  iVar1 = strcasecmp(pcVar3,"-ccat");
  if (iVar1 == 0) {
    pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x40);
    if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
      return 0x9811000a;
    }
    pcVar3 = "CCAT";
    dwSize = 0x40;
    dwSignature = 0xba12cab1;
  }
  else {
    iVar1 = strcasecmp(pcVar3,"-eg20t");
    if (iVar1 == 0) {
      pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x40);
      if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
        return 0x9811000a;
      }
      pcVar3 = "EG20T";
      dwSize = 0x40;
      dwSignature = 0xba12cb01;
    }
    else {
      iVar1 = strcasecmp(pcVar3,"-i8254x");
      if (iVar1 == 0) {
        pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x50);
        if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
          return 0x9811000a;
        }
        pcVar3 = "I8254x";
        dwSize = 0x50;
        dwSignature = 0xba12ca31;
      }
      else {
        iVar1 = strcasecmp(pcVar3,"-i8255x");
        if (iVar1 == 0) {
          pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x40);
          if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
            return 0x9811000a;
          }
          pcVar3 = "I8255x";
          dwSize = 0x40;
          dwSignature = 0xba12ca21;
        }
        else {
          iVar1 = strcasecmp(pcVar3,"-r6040");
          if (iVar1 == 0) {
            pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x40);
            if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
              return 0x9811000a;
            }
            pcVar3 = "R6040";
            dwSize = 0x40;
            dwSignature = 0xba12cb11;
          }
          else {
            iVar1 = strcasecmp(pcVar3,"-rtl8139");
            if (iVar1 != 0) {
              iVar1 = strcasecmp(pcVar3,"-rtl8169");
              if (iVar1 == 0) {
                pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x48);
                if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
                  return 0x9811000a;
                }
                pcVar3 = "RTL8169";
                LinkParmsInit(pLinkParms,0xba12ca52,0x48,"RTL8169",dwInstance,in_R9D,in_EAX);
                pEVar5 = &pLinkParms->dwInstance;
                EVar2 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar5,tcStorage_02,(EC_T_DWORD *)pcVar3);
                if ((EVar2 == 0) ||
                   (EVar2 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar5,tcStorage_03,
                                          &pLinkParms->eLinkMode), EVar2 == 0)) goto LAB_0014e91f;
                pLinkParms[1].dwSignature = 0;
                goto LAB_0014e8c4;
              }
              iVar1 = strcasecmp(pcVar3,"-sockraw");
              if (iVar1 != 0) {
                return 0x9811000c;
              }
              pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x88);
              if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
                return 0x9811000a;
              }
              LinkParmsInit(pLinkParms,0xba12cc11,0x88,"SockRaw",dwInstance,in_R9D,in_EAX);
              pcVar3 = strtok((char *)0x0," ");
              *ptcWord = pcVar3;
              if (((pcVar3 != (char *)0x0) && (*pcVar3 != '-')) &&
                 (sVar4 = strlen(pcVar3), sVar4 < 0x40)) {
                strncpy((char *)(pLinkParms + 1),pcVar3,0x3f);
                pLinkParms[2].dwSignature = 1;
                goto LAB_0014e8c4;
              }
              goto LAB_0014e91f;
            }
            pLinkParms = (EC_T_LINK_PARMS *)calloc(1,0x48);
            if (pLinkParms == (EC_T_LINK_PARMS *)0x0) {
              return 0x9811000a;
            }
            pcVar3 = "RTL8139";
            dwSize = 0x48;
            dwSignature = 0xba12ca41;
          }
        }
      }
    }
  }
  LinkParmsInit(pLinkParms,dwSignature,dwSize,pcVar3,dwInstance,in_R9D,in_EAX);
  pEVar5 = &pLinkParms->dwInstance;
  EVar2 = ParseDword(ptcWord,(EC_T_CHAR **)pEVar5,tcStorage_00,(EC_T_DWORD *)pcVar3);
  if ((EVar2 != 0) &&
     (EVar2 = ParseLinkMode(ptcWord,(EC_T_CHAR **)pEVar5,tcStorage_01,&pLinkParms->eLinkMode),
     EVar2 != 0)) {
LAB_0014e8c4:
    *ppLinkParms = pLinkParms;
    return 0;
  }
LAB_0014e91f:
  free(pLinkParms);
  return 0x9811000b;
}

Assistant:

EC_T_DWORD CreateLinkParmsFromCmdLine
(   EC_T_CHAR**     ptcWord,
    EC_T_CHAR**     lpCmdLine,
    EC_T_CHAR*      tcStorage,
    EC_T_BOOL*      pbGetNextWord,  /* [out]  Shows that next parameter should be read or not */
    EC_T_LINK_PARMS** ppLinkParms
)
{
EC_T_DWORD dwRetVal = EC_E_NOTFOUND;

#if (defined INCLUDE_CCAT)
    dwRetVal = CreateLinkParmsFromCmdLineCCAT(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_EG20T)
    dwRetVal = CreateLinkParmsFromCmdLineEG20T(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_CPSW)
    dwRetVal = CreateLinkParmsFromCmdLineCPSW(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_EMAC)
    dwRetVal = CreateLinkParmsFromCmdLineEMAC(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_ETSEC)
    dwRetVal = CreateLinkParmsFromCmdLineETSEC(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_FSLFEC)
    dwRetVal = CreateLinkParmsFromCmdLineFslFec(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_GEM)
    dwRetVal = CreateLinkParmsFromCmdLineGEM(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_I8254X)
    dwRetVal = CreateLinkParmsFromCmdLineI8254x(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_I8255X)
    dwRetVal = CreateLinkParmsFromCmdLineI8255x(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_ICSS)
    dwRetVal = CreateLinkParmsFromCmdLineICSS(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_L9218I)
    dwRetVal = CreateLinkParmsFromCmdLineL9218i(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_NDISUIO)
    dwRetVal = CreateLinkParmsFromCmdLineNDISUIO(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_PXAMFU)
    dwRetVal = CreateLinkParmsFromCmdLinePXAMFU(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_R6040)
    dwRetVal = CreateLinkParmsFromCmdLineR6040(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined EC_VERSION_RIN32M3)
    dwRetVal = CreateLinkParmsFromCmdLineRIN32M3(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_RTL8139)
    dwRetVal = CreateLinkParmsFromCmdLineRTL8139(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_RTL8169)
    dwRetVal = CreateLinkParmsFromCmdLineRTL8169(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined EC_VERSION_RZT1)
    dwRetVal = CreateLinkParmsFromCmdLineRZT1(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SNARF)
    dwRetVal = CreateLinkParmsFromCmdLineSnarf(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SHETH)
    dwRetVal = CreateLinkParmsFromCmdLineSHEth(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_SOCKRAW)
    dwRetVal = CreateLinkParmsFromCmdLineSockRaw(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_WINPCAP)
    dwRetVal = CreateLinkParmsFromCmdLineWinPcap(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_DW3504)
    dwRetVal = CreateLinkParmsFromCmdLineDW3504(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
#if (defined INCLUDE_DUMMY)
    dwRetVal = CreateLinkParmsFromCmdLineDummy(ptcWord, lpCmdLine, tcStorage, pbGetNextWord, ppLinkParms);
    if (EC_E_NOTFOUND != dwRetVal)
    {
        goto Exit;
    }
#endif
Exit:
    return dwRetVal;
}